

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

void __thiscall
duckdb::ClientContext::ClientContext
          (ClientContext *this,shared_ptr<duckdb::DatabaseInstance,_true> *database)

{
  _Head_base<0UL,_duckdb::Logger_*,_false> _Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  LoggingContext context;
  pointer __p;
  _Head_base<0UL,_duckdb::Logger_*,_false> _Var4;
  __uniq_ptr_impl<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_> __p_00;
  DatabaseInstance *pDVar5;
  type pLVar6;
  _Head_base<0UL,_duckdb::ClientData_*,_false> local_98;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined1 uStack_78;
  undefined7 uStack_77;
  undefined1 uStack_70;
  undefined7 uStack_6f;
  undefined1 uStack_68;
  undefined7 uStack_67;
  bool bStack_60;
  LogMode LStack_5f;
  LogLevel LStack_5e;
  undefined5 uStack_5d;
  undefined7 local_58;
  char cStack_51;
  undefined3 uStack_50;
  undefined4 uStack_4d;
  char cStack_49;
  undefined3 uStack_48;
  undefined4 uStack_45;
  undefined1 uStack_41;
  undefined3 uStack_40;
  undefined4 uStack_3d;
  undefined4 uStack_39;
  undefined4 uStack_35;
  
  (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> =
       (__weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (database->internal).
           super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (database->internal).
           super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (database->internal).super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  (this->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  (database->internal).super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->interrupted)._M_base._M_i = false;
  local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->registered_state;
  this->registered_state =
       (unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
        )0x0;
  this->logger = (unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>)0x0;
  ClientConfig::ClientConfig(&this->config);
  (this->client_data).super_unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_>
  ._M_t.super___uniq_ptr_impl<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ClientData_*,_std::default_delete<duckdb::ClientData>_>.
  super__Head_base<0UL,_duckdb::ClientData_*,_false>._M_head_impl = (ClientData *)0x0;
  local_88 = &this->config;
  TransactionContext::TransactionContext(&this->transaction,this);
  *(undefined1 (*) [16])&(this->context_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->context_lock).super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->context_lock).super___mutex_base._M_mutex = (undefined1  [16])0x0;
  QueryProgress::QueryProgress(&this->query_progress);
  this->connection_id = 0xffffffffffffffff;
  make_uniq<duckdb::RegisteredStateManager>();
  __p = (pointer)CONCAT17(cStack_51,local_58);
  local_58 = 0;
  _cStack_51 = _cStack_51 & 0xffffff00;
  ::std::
  __uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
  ::reset((__uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
           *)local_90._M_pi,__p);
  ::std::
  unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>::
  ~unique_ptr((unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
               *)&stack0xffffffffffffffa8);
  _uStack_41 = 0xffffffff;
  uStack_3d = 0xffffffff;
  uStack_39 = 0xffffffff;
  uStack_35 = 0xffffffff;
  _cStack_51 = 0xffffffff;
  uStack_4d = 0xffffffff;
  _cStack_49 = 0xffffffff;
  uStack_45 = 0xffffffff;
  pDVar5 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&this->db);
  pLVar6 = shared_ptr<duckdb::LogManager,_true>::operator*(&pDVar5->log_manager);
  local_80 = '\x14';
  uStack_77 = CONCAT43(uStack_4d,uStack_50);
  uStack_6f = CONCAT43(uStack_45,uStack_48);
  uStack_67 = CONCAT43(uStack_3d,uStack_40);
  uStack_7f = local_58;
  uStack_78 = cStack_51;
  uStack_70 = cStack_49;
  uStack_68 = uStack_41;
  bStack_60 = SUB41(uStack_39,0);
  _LStack_5f = (undefined7)(CONCAT44(uStack_35,uStack_39) >> 8);
  context.query_id.index._1_1_ = LStack_5f;
  context.query_id.index._2_1_ = LStack_5e;
  context.query_id.index._3_5_ = uStack_5d;
  context.query_id.index._0_1_ = bStack_60;
  context._1_7_ = local_58;
  context.scope = 0x14;
  context.thread_id.index._1_7_ = uStack_77;
  context.thread_id.index._0_1_ = cStack_51;
  context.connection_id.index._1_7_ = uStack_6f;
  context.connection_id.index._0_1_ = cStack_49;
  context.transaction_id.index._1_7_ = uStack_67;
  context.transaction_id.index._0_1_ = uStack_41;
  LogManager::CreateLogger((LogManager *)&stack0xffffffffffffff68,context,SUB81(pLVar6,0),true);
  _Var4._M_head_impl = (Logger *)local_98._M_head_impl;
  local_98._M_head_impl = (ClientData *)0x0;
  _Var1._M_head_impl =
       (this->logger).super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
       super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
       super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl;
  (this->logger).super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
  super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
  super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var1._M_head_impl != (Logger *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_Logger + 8))();
    if (local_98._M_head_impl != (ClientData *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  make_uniq<duckdb::ClientData,duckdb::ClientContext&>((duckdb *)&stack0xffffffffffffff68,this);
  __p_00._M_t.super__Tuple_impl<0UL,_duckdb::ClientData_*,_std::default_delete<duckdb::ClientData>_>
  .super__Head_base<0UL,_duckdb::ClientData_*,_false>._M_head_impl =
       (tuple<duckdb::ClientData_*,_std::default_delete<duckdb::ClientData>_>)
       (tuple<duckdb::ClientData_*,_std::default_delete<duckdb::ClientData>_>)local_98._M_head_impl;
  local_98._M_head_impl = (ClientData *)0x0;
  ::std::__uniq_ptr_impl<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_>::reset
            ((__uniq_ptr_impl<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_> *)
             &this->client_data,
             (pointer)__p_00._M_t.
                      super__Tuple_impl<0UL,_duckdb::ClientData_*,_std::default_delete<duckdb::ClientData>_>
                      .super__Head_base<0UL,_duckdb::ClientData_*,_false>._M_head_impl);
  ::std::unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_>::~unique_ptr
            ((unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_> *)
             &stack0xffffffffffffff68);
  return;
}

Assistant:

ClientContext::ClientContext(shared_ptr<DatabaseInstance> database)
    : db(std::move(database)), interrupted(false), transaction(*this), connection_id(DConstants::INVALID_INDEX) {
	registered_state = make_uniq<RegisteredStateManager>();
#ifdef DEBUG
	registered_state->GetOrCreate<DebugClientContextState>("debug_client_context_state");
#endif
	LoggingContext context(LogContextScope::CONNECTION);
	logger = db->GetLogManager().CreateLogger(context, true);
	client_data = make_uniq<ClientData>(*this);
}